

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O2

uint64_t __thiscall fast_float::bigint::hi64(bigint *this,bool *truncated)

{
  ushort uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = (this->vec).length;
  if (uVar1 == 1) {
    uVar8 = (this->vec).data[(ulong)uVar1 - 1];
    *truncated = false;
    lVar3 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    uVar8 = uVar8 << (~(byte)lVar3 & 0x3f);
  }
  else if (uVar1 == 0) {
    *truncated = false;
    uVar8 = 0;
  }
  else {
    uVar2 = (this->vec).data[(ulong)uVar1 - 2];
    uVar8 = (this->vec).data[(ulong)uVar1 - 1];
    uVar4 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar7 = uVar2;
    if ((uVar4 ^ 0x3f) != 0) {
      bVar6 = (byte)(uVar4 ^ 0x3f);
      uVar7 = uVar2 << (bVar6 & 0x3f);
      bVar6 = bVar6 & 0x3f;
      uVar8 = uVar8 << bVar6 | uVar2 >> 0x40 - bVar6;
    }
    *truncated = uVar7 != 0;
    bVar5 = stackvec<(unsigned_short)62>::nonzero(&this->vec,2);
    *truncated = (bool)(*truncated | bVar5);
  }
  return uVar8;
}

Assistant:

uint64_t hi64(bool& truncated) const noexcept {
#ifdef FASTFLOAT_64BIT_LIMB
    if (vec.len() == 0) {
      return empty_hi64(truncated);
    } else if (vec.len() == 1) {
      return uint64_hi64(vec.rindex(0), truncated);
    } else {
      uint64_t result = uint64_hi64(vec.rindex(0), vec.rindex(1), truncated);
      truncated |= vec.nonzero(2);
      return result;
    }
#else
    if (vec.len() == 0) {
      return empty_hi64(truncated);
    } else if (vec.len() == 1) {
      return uint32_hi64(vec.rindex(0), truncated);
    } else if (vec.len() == 2) {
      return uint32_hi64(vec.rindex(0), vec.rindex(1), truncated);
    } else {
      uint64_t result = uint32_hi64(vec.rindex(0), vec.rindex(1), vec.rindex(2), truncated);
      truncated |= vec.nonzero(3);
      return result;
    }
#endif
  }